

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  path *__return_storage_ptr__;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference this_00;
  string *psVar4;
  bool local_1bc;
  bool local_1b9;
  iterator local_1b0;
  iterator local_170;
  byte local_129;
  undefined1 local_128 [7];
  bool first;
  iterator iter;
  bool local_c1;
  path local_c0;
  byte local_99;
  path local_98;
  byte local_75;
  path local_68;
  byte local_41;
  path local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  path *p_local;
  path *this_local;
  
  local_20 = &p->_path;
  p_local = this;
  bVar1 = empty(p);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      return this;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == '/') {
      return this;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == ':') {
      return this;
    }
    std::__cxx11::string::operator+=((string *)this,'/');
    return this;
  }
  bVar1 = is_absolute((path *)local_20);
  local_41 = 0;
  local_75 = 0;
  local_99 = 0;
  local_c1 = false;
  if (bVar1) {
    path<std::__cxx11::string,ghc::filesystem::path>(&local_40,&this->_path,auto_format);
    local_41 = 1;
    root_name(&local_68,this);
    local_75 = 1;
    bVar1 = filesystem::operator!=(&local_40,&local_68);
    local_1b9 = true;
    if (bVar1) goto LAB_001a2854;
    bVar1 = std::operator!=(local_20,"/");
    local_1b9 = true;
    if (bVar1) goto LAB_001a2854;
  }
  local_c1 = has_root_name((path *)local_20);
  local_1bc = false;
  if (local_c1) {
    root_name(&local_98,(path *)local_20);
    local_99 = 1;
    root_name(&local_c0,this);
    local_1bc = filesystem::operator!=(&local_98,&local_c0);
  }
  local_1b9 = local_1bc;
LAB_001a2854:
  if (local_c1 != false) {
    ~path(&local_c0);
  }
  if ((local_99 & 1) != 0) {
    ~path(&local_98);
  }
  if ((local_75 & 1) != 0) {
    ~path(&local_68);
  }
  if ((local_41 & 1) != 0) {
    ~path(&local_40);
  }
  this_local = this;
  if (local_1b9 == false) {
    bVar1 = has_root_directory((path *)local_20);
    if (bVar1) {
      __return_storage_ptr__ = (path *)((long)&iter._current._path.field_2 + 8);
      root_name(__return_storage_ptr__,this);
      assign<ghc::filesystem::path>(this,__return_storage_ptr__);
      ~path((path *)((long)&iter._current._path.field_2 + 8));
    }
    else {
      bVar1 = has_root_directory(this);
      if (((!bVar1) && (bVar1 = is_absolute(this), bVar1)) || (bVar1 = has_filename(this), bVar1)) {
        std::__cxx11::string::operator+=((string *)this,'/');
      }
    }
    begin((iterator *)local_128,(path *)local_20);
    local_129 = 1;
    bVar1 = has_root_name((path *)local_20);
    if (bVar1) {
      iterator::operator++((iterator *)local_128);
    }
    while( true ) {
      end(&local_170,(path *)local_20);
      bVar1 = iterator::operator!=((iterator *)local_128,&local_170);
      iterator::~iterator(&local_170);
      if (!bVar1) break;
      if ((local_129 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::length();
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
          if (*pcVar3 == '/') goto LAB_001a2b17;
        }
        std::__cxx11::string::operator+=((string *)this,'/');
      }
LAB_001a2b17:
      local_129 = 0;
      iterator::operator++(&local_1b0,(iterator *)local_128,0);
      this_00 = iterator::operator*(&local_1b0);
      psVar4 = generic_string_abi_cxx11_(this_00);
      std::__cxx11::string::operator+=((string *)this,(string *)psVar4);
      iterator::~iterator(&local_1b0);
    }
    iterator::~iterator((iterator *)local_128);
  }
  else {
    assign<ghc::filesystem::path>(this,(path *)local_20);
  }
  return this_local;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != '/' && _path[_path.length() - 1] != ':') {
            _path += '/';
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name() || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += '/';
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == '/')) {
            _path += '/';
        }
        first = false;
        _path += (*iter++).generic_string();
    }
    return *this;
}